

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  TestCase *pTVar1;
  RunningTest *pRVar2;
  pointer pUVar3;
  uint uVar4;
  pointer __pos;
  StreamRedirect cerrRedir;
  StreamRedirect coutRedir;
  string local_408;
  StreamRedirect local_3e8;
  undefined1 local_258 [48];
  char local_228 [16];
  size_t local_218;
  _Alloc_hider local_210;
  char local_200 [16];
  Flags local_1f0;
  
  local_3e8.m_stream = (ostream *)&local_3e8.m_oss;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"TEST_CASE","");
  pTVar1 = this->m_runningTest->m_info;
  local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"");
  AssertionInfo::AssertionInfo
            ((AssertionInfo *)local_258,(string *)&local_3e8,&(pTVar1->super_TestCaseInfo).lineInfo,
             &local_408,Normal);
  std::__cxx11::string::operator=((string *)&this->m_lastAssertionInfo,(string *)local_258);
  std::__cxx11::string::_M_assign((string *)&(this->m_lastAssertionInfo).lineInfo);
  (this->m_lastAssertionInfo).lineInfo.line = local_218;
  std::__cxx11::string::operator=
            ((string *)&(this->m_lastAssertionInfo).capturedExpression,(string *)&local_210);
  (this->m_lastAssertionInfo).resultDisposition = local_1f0;
  if (local_210._M_p != local_200) {
    operator_delete(local_210._M_p);
  }
  if ((char *)local_258._32_8_ != local_228) {
    operator_delete((void *)local_258._32_8_);
  }
  if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
    operator_delete((void *)local_258._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408._M_dataplus._M_p != &local_408.field_2) {
    operator_delete(local_408._M_dataplus._M_p);
  }
  if (local_3e8.m_stream != (ostream *)&local_3e8.m_oss) {
    operator_delete(local_3e8.m_stream);
  }
  pRVar2 = this->m_runningTest;
  pRVar2->m_runStatus = NothingRun;
  pRVar2->m_changed = false;
  pRVar2->m_lastSectionToRun = (RunningSection *)0x0;
  uVar4 = (*(((this->m_reporter).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  if ((uVar4 & 1) == 0) {
    (*(((this->m_runningTest->m_info->test).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable
      [4])();
  }
  else {
    StreamRedirect::StreamRedirect((StreamRedirect *)local_258,(ostream *)&std::cout,redirectedCout)
    ;
    StreamRedirect::StreamRedirect(&local_3e8,(ostream *)&std::cerr,redirectedCerr);
    (*(((this->m_runningTest->m_info->test).m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable
      [4])();
    StreamRedirect::~StreamRedirect(&local_3e8);
    StreamRedirect::~StreamRedirect((StreamRedirect *)local_258);
  }
  RunningTest::ranToCompletion(this->m_runningTest);
  __pos = (this->m_unfinishedSections).
          super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pUVar3 = (this->m_unfinishedSections).
           super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__pos != pUVar3) {
    do {
      (*(this->super_IResultCapture)._vptr_IResultCapture[4])(this,__pos,&__pos->prevAssertions);
      __pos = __pos + 1;
    } while (__pos != pUVar3);
    __pos = (this->m_unfinishedSections).
            super__Vector_base<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
            ._M_impl.super__Vector_impl_data._M_start;
  }
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::_M_erase_at_end(&this->m_unfinishedSections,__pos);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
            (&this->m_messages,
             (this->m_messages).
             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
             super__Vector_impl_data._M_start);
  return;
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            try {
                m_lastAssertionInfo = AssertionInfo( "TEST_CASE", m_runningTest->getTestCase().getTestCaseInfo().lineInfo, "", ResultDisposition::Normal );
                m_runningTest->reset();

                if( m_reporter->getPreferences().shouldRedirectStdOut ) {
                    StreamRedirect coutRedir( std::cout, redirectedCout );
                    StreamRedirect cerrRedir( std::cerr, redirectedCerr );
                    m_runningTest->getTestCase().invoke();
                }
                else {
                    m_runningTest->getTestCase().invoke();
                }
                m_runningTest->ranToCompletion();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                ExpressionResultBuilder exResult( ResultWas::ThrewException );
                exResult << translateActiveException();
                actOnCurrentResult( exResult.buildResult( m_lastAssertionInfo )  );
            }
            for( std::vector<UnfinishedSections>::const_iterator it = m_unfinishedSections.begin(),
                        itEnd = m_unfinishedSections.end();
                    it != itEnd;
                    ++it )
                sectionEnded( it->info, it->prevAssertions );
            m_unfinishedSections.clear();
            m_messages.clear();
        }